

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

void __thiscall SkipList::SkipList(SkipList *this)

{
  result_type rVar1;
  Node *this_00;
  SkipList *this_local;
  
  std::random_device::random_device(&this->rd);
  rVar1 = std::random_device::operator()(&this->rd);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->mt,(ulong)rVar1);
  this_00 = (Node *)operator_new(0x38);
  Node::Node(this_00);
  this->head = this_00;
  this->length = 0;
  this->valueSize = 0;
  return;
}

Assistant:

SkipList::SkipList()
    : rd(), mt(rd()), head(new Node), length(0), valueSize(0) {}